

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O0

void __thiscall
xray_re::mp_rpoint_io::operator()(mp_rpoint_io *this,mp_rpoint **_rpoint,xr_reader *r)

{
  uint8_t uVar1;
  mp_rpoint *v;
  mp_rpoint *rpoint;
  xr_reader *r_local;
  mp_rpoint **_rpoint_local;
  mp_rpoint_io *this_local;
  
  v = (mp_rpoint *)operator_new(0x1c);
  *_rpoint = v;
  xr_reader::r_fvector3(r,(fvector3 *)v);
  xr_reader::r_fvector3(r,&v->a);
  uVar1 = xr_reader::r_u8(r);
  v->team = uVar1;
  uVar1 = xr_reader::r_u8(r);
  v->respawn = uVar1;
  uVar1 = xr_reader::r_u8(r);
  v->game = uVar1;
  xr_reader::advance(r,1);
  return;
}

Assistant:

void mp_rpoint_io::operator()(mp_rpoint*& _rpoint, xr_reader& r) const
{
	mp_rpoint* rpoint = new mp_rpoint;
	_rpoint = rpoint;
	r.r_fvector3(rpoint->p);
	r.r_fvector3(rpoint->a);
	rpoint->team = r.r_u8();
	rpoint->respawn = r.r_u8();
	rpoint->game = r.r_u8();
	r.advance(sizeof(uint8_t));
}